

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSExportEntry *
add_export_entry2(JSContext *ctx,JSParseState *s,JSModuleDef *m,JSAtom param_4,JSAtom export_name,
                 JSExportTypeEnum export_type)

{
  JSExportEntry *pJVar1;
  JSAtomStruct *pJVar2;
  JSExportEntry *pJVar3;
  int iVar4;
  JSExportEntry *pJVar5;
  char *pcVar6;
  JSAtom atom;
  char buf1 [64];
  
  atom = param_4;
  pJVar5 = find_export_entry((JSContext *)m,(JSModuleDef *)(ulong)export_name,(JSAtom)m);
  if (pJVar5 == (JSExportEntry *)0x0) {
    iVar4 = js_resize_array(ctx,&m->export_entries,0x20,&m->export_entries_size,
                            m->export_entries_count + 1);
    if (iVar4 == 0) {
      pJVar1 = m->export_entries;
      iVar4 = m->export_entries_count;
      m->export_entries_count = iVar4 + 1;
      pJVar5 = pJVar1 + iVar4;
      pJVar3 = pJVar1 + iVar4;
      pJVar3->export_type = JS_EXPORT_TYPE_LOCAL;
      pJVar3->local_name = 0;
      *(undefined8 *)(&pJVar3->export_type + 2) = 0;
      *(undefined8 *)&pJVar1[iVar4].u = 0;
      pJVar1[iVar4].u.local.var_ref = (JSVarRef *)0x0;
      if (0xd1 < (int)param_4) {
        pJVar2 = ctx->rt->atom_array[param_4];
        (pJVar2->header).ref_count = (pJVar2->header).ref_count + 1;
      }
      pJVar5->local_name = param_4;
      if (0xd1 < (int)export_name) {
        pJVar2 = ctx->rt->atom_array[export_name];
        (pJVar2->header).ref_count = (pJVar2->header).ref_count + 1;
      }
      pJVar5->export_name = export_name;
      pJVar5->export_type = export_type;
      return pJVar5;
    }
  }
  else if (s == (JSParseState *)0x0) {
    __JS_ThrowSyntaxErrorAtom(ctx,export_name,"duplicate exported name \'%s\'");
  }
  else {
    pcVar6 = JS_AtomGetStr(ctx,buf1,export_name,atom);
    js_parse_error(s,"duplicate exported name \'%s\'",pcVar6);
  }
  return (JSExportEntry *)0x0;
}

Assistant:

static JSExportEntry *add_export_entry2(JSContext *ctx,
                                        JSParseState *s, JSModuleDef *m,
                                       JSAtom local_name, JSAtom export_name,
                                       JSExportTypeEnum export_type)
{
    JSExportEntry *me;

    if (find_export_entry(ctx, m, export_name)) {
        char buf1[ATOM_GET_STR_BUF_SIZE];
        if (s) {
            js_parse_error(s, "duplicate exported name '%s'",
                           JS_AtomGetStr(ctx, buf1, sizeof(buf1), export_name));
        } else {
            JS_ThrowSyntaxErrorAtom(ctx, "duplicate exported name '%s'", export_name);
        }
        return NULL;
    }

    if (js_resize_array(ctx, (void **)&m->export_entries,
                        sizeof(JSExportEntry),
                        &m->export_entries_size,
                        m->export_entries_count + 1))
        return NULL;
    me = &m->export_entries[m->export_entries_count++];
    memset(me, 0, sizeof(*me));
    me->local_name = JS_DupAtom(ctx, local_name);
    me->export_name = JS_DupAtom(ctx, export_name);
    me->export_type = export_type;
    return me;
}